

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

HeapType __thiscall
wasm::SExpressionWasmBuilder::getFunctionType(SExpressionWasmBuilder *this,Name name,Element *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  size_t sVar4;
  iterator iVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  Name name_local;
  char local_38 [16];
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_58 = name.super_IString.str._M_len;
  iVar5 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::HeapType>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::HeapType>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
          ::find(&(this->functionTypes)._M_t,(key_type *)local_58);
  if ((_Rb_tree_header *)iVar5._M_node != &(this->functionTypes)._M_t._M_impl.super__Rb_tree_header)
  {
    return (HeapType)(uintptr_t)iVar5._M_node[1]._M_left;
  }
  psVar6 = (string *)__cxa_allocate_exception(0x30);
  name_local.super_IString.str._M_str = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name_local.super_IString.str._M_str,name_local.super_IString.str._M_len,
             (long)local_58 + name_local.super_IString.str._M_len);
  std::operator+(&local_78,"invalid call target: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_local.super_IString.str._M_str);
  sVar3 = s->line;
  uVar1 = *(undefined4 *)((long)&s->line + 4);
  sVar4 = s->col;
  uVar2 = *(undefined4 *)((long)&s->col + 4);
  *(string **)psVar6 = psVar6 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            (psVar6,local_78._M_dataplus._M_p,local_78._M_dataplus._M_p + local_78._M_string_length)
  ;
  *(int *)(psVar6 + 0x20) = (int)sVar3;
  *(undefined4 *)(psVar6 + 0x24) = uVar1;
  *(int *)(psVar6 + 0x28) = (int)sVar4;
  *(undefined4 *)(psVar6 + 0x2c) = uVar2;
  __cxa_throw(psVar6,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

HeapType SExpressionWasmBuilder::getFunctionType(Name name, Element& s) {
  auto iter = functionTypes.find(name);
  if (iter == functionTypes.end()) {
    throw ParseException(
      "invalid call target: " + std::string(name.str), s.line, s.col);
  }
  return iter->second;
}